

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O1

value value_from_string(value v,char *str,size_t length)

{
  size_t sVar1;
  value pvVar2;
  ulong bytes;
  
  if (length != 0 && (str != (char *)0x0 && v != (value)0x0)) {
    sVar1 = value_size(v);
    bytes = length + 1;
    if (sVar1 <= length + 1) {
      bytes = sVar1;
    }
    pvVar2 = value_from(v,str,bytes);
    return pvVar2;
  }
  return v;
}

Assistant:

value value_from_string(value v, const char *str, size_t length)
{
	if (v != NULL && str != NULL && length > 0)
	{
		size_t current_size = value_size(v);

		size_t bytes = length + 1;

		size_t size = (bytes <= current_size) ? bytes : current_size;

		return value_from(v, str, size);
	}

	return v;
}